

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O3

spv_result_t spvtools::val::ValidateExtension(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  int iVar2;
  spv_parsed_instruction_t *in_RDX;
  string extension;
  string local_218;
  DiagnosticStream local_1f8;
  
  if (0x103ff < _->version_) {
    return SPV_SUCCESS;
  }
  GetExtensionString_abi_cxx11_(&local_218,(spvtools *)&inst->inst_,in_RDX);
  ExtensionToString(kSPV_KHR_workgroup_memory_explicit_layout);
  iVar2 = std::__cxx11::string::compare((char *)&local_218);
  if (iVar2 != 0) {
    ExtensionToString(kSPV_EXT_mesh_shader);
    iVar2 = std::__cxx11::string::compare((char *)&local_218);
    if (iVar2 != 0) {
      ExtensionToString(kSPV_NV_shader_invocation_reorder);
      iVar2 = std::__cxx11::string::compare((char *)&local_218);
      if (iVar2 != 0) {
        ExtensionToString(kSPV_NV_cluster_acceleration_structure);
        iVar2 = std::__cxx11::string::compare((char *)&local_218);
        if (iVar2 != 0) {
          ExtensionToString(kSPV_NV_linear_swept_spheres);
          iVar2 = std::__cxx11::string::compare((char *)&local_218);
          if (iVar2 != 0) {
            bVar1 = true;
            goto LAB_0065f303;
          }
        }
      }
    }
  }
  ValidationState_t::diag(&local_1f8,_,SPV_ERROR_WRONG_VERSION,inst);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1f8,local_218._M_dataplus._M_p,local_218._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1f8," extension requires SPIR-V version 1.4 or later.",0x30);
  inst = (Instruction *)(ulong)(uint)local_1f8.error_;
  DiagnosticStream::~DiagnosticStream(&local_1f8);
  bVar1 = false;
LAB_0065f303:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    return SPV_SUCCESS;
  }
  return (spv_result_t)inst;
}

Assistant:

spv_result_t ValidateExtension(ValidationState_t& _, const Instruction* inst) {
  if (_.version() < SPV_SPIRV_VERSION_WORD(1, 4)) {
    std::string extension = GetExtensionString(&(inst->c_inst()));
    if (extension ==
            ExtensionToString(kSPV_KHR_workgroup_memory_explicit_layout) ||
        extension == ExtensionToString(kSPV_EXT_mesh_shader) ||
        extension == ExtensionToString(kSPV_NV_shader_invocation_reorder) ||
        extension ==
            ExtensionToString(kSPV_NV_cluster_acceleration_structure) ||
        extension == ExtensionToString(kSPV_NV_linear_swept_spheres)) {
      return _.diag(SPV_ERROR_WRONG_VERSION, inst)
             << extension << " extension requires SPIR-V version 1.4 or later.";
    }
  }

  return SPV_SUCCESS;
}